

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks5.c
# Opt level: O0

char * socks5_response_text(uchar m)

{
  char *pcStack_10;
  uchar m_local;
  
  switch(m) {
  case '\0':
    pcStack_10 = "success";
    break;
  case '\x01':
    pcStack_10 = "unspecified failure";
    break;
  case '\x02':
    pcStack_10 = "connection not allowed by ruleset";
    break;
  case '\x03':
    pcStack_10 = "network unreachable";
    break;
  case '\x04':
    pcStack_10 = "host unreachable";
    break;
  case '\x05':
    pcStack_10 = "connection refused";
    break;
  case '\x06':
    pcStack_10 = "TTL expired";
    break;
  case '\a':
    pcStack_10 = "command not supported";
    break;
  case '\b':
    pcStack_10 = "address type not supported";
    break;
  default:
    pcStack_10 = "unknown";
  }
  return pcStack_10;
}

Assistant:

static inline const char *socks5_response_text(unsigned char m)
{
    switch (m) {
      case SOCKS5_RESP_SUCCESS: return "success";
      case SOCKS5_RESP_FAILURE: return "unspecified failure";
      case SOCKS5_RESP_CONNECTION_NOT_ALLOWED_BY_RULESET:
        return "connection not allowed by ruleset";
      case SOCKS5_RESP_NETWORK_UNREACHABLE: return "network unreachable";
      case SOCKS5_RESP_HOST_UNREACHABLE: return "host unreachable";
      case SOCKS5_RESP_CONNECTION_REFUSED: return "connection refused";
      case SOCKS5_RESP_TTL_EXPIRED: return "TTL expired";
      case SOCKS5_RESP_COMMAND_NOT_SUPPORTED: return "command not supported";
      case SOCKS5_RESP_ADDRTYPE_NOT_SUPPORTED:
        return "address type not supported";
      default: return "unknown";
    }
}